

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientKeepAlive.cpp
# Opt level: O3

void __thiscall
ki::protocol::control::ClientKeepAlive::write_to(ClientKeepAlive *this,ostream *ostream)

{
  Field<unsigned_short> *pFVar1;
  Record record;
  string local_c8;
  string local_a8;
  string local_88;
  Record local_68;
  
  ki::dml::Record::Record(&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"m_session_id","");
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(&local_68,&local_88,true);
  pFVar1->m_value = this->m_session_id;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"m_milliseconds","");
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(&local_68,&local_a8,true);
  pFVar1->m_value = this->m_milliseconds;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"m_minutes","");
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(&local_68,&local_c8,true);
  pFVar1->m_value = this->m_minutes;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  ki::dml::Record::write_to(&local_68,ostream);
  ki::dml::Record::~Record(&local_68);
  return;
}

Assistant:

void ClientKeepAlive::write_to(std::ostream &ostream) const
	{
		dml::Record record;
		record.add_field<dml::USHRT>("m_session_id")->set_value(m_session_id);
		record.add_field<dml::USHRT>("m_milliseconds")->set_value(m_milliseconds);
		record.add_field<dml::USHRT>("m_minutes")->set_value(m_minutes);
		record.write_to(ostream);
	}